

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O1

void __thiscall
helics::EndpointInfo::addDestination
          (EndpointInfo *this,GlobalHandle dest,string_view destName,string_view destType)

{
  pointer pEVar1;
  pointer ppVar2;
  pointer pEVar3;
  EndpointInformation *tinfo;
  pointer pEVar4;
  bool bVar5;
  GlobalHandle local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_38._M_str = destType._M_str;
  local_38._M_len = destType._M_len;
  local_28._M_str = destName._M_str;
  local_28._M_len = destName._M_len;
  pEVar4 = (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pEVar4 == pEVar1;
  if (!bVar5) {
    if (((pEVar4->id).fed_id.gid != dest.fed_id.gid.gid) ||
       ((pEVar4->id).handle.hid != dest.handle.hid.hid)) {
      pEVar4 = pEVar4 + 1;
      do {
        pEVar3 = pEVar4;
        bVar5 = pEVar3 == pEVar1;
        if (bVar5) goto LAB_0032fc78;
        pEVar4 = pEVar3 + 1;
      } while (((pEVar3->id).fed_id.gid != dest.fed_id.gid.gid) ||
              ((pEVar3->id).handle.hid != dest.handle.hid.hid));
    }
    if (!bVar5) {
      return;
    }
  }
LAB_0032fc78:
  local_40 = dest;
  std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>::
  emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>> *)
             &this->targetInformation,&local_40,&local_28,&local_38);
  std::
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::reserve(&this->targets,
            ((long)(this->targetInformation).
                   super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->targetInformation).
                   super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  ppVar2 = (this->targets).
           super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->targets).
      super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->targets).
    super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  pEVar1 = (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar4 = (this->targetInformation).
                super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    std::
    vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
    ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
              ((vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
                *)&this->targets,&pEVar4->id,&pEVar4->key);
  }
  return;
}

Assistant:

void EndpointInfo::addDestination(GlobalHandle dest,
                                  std::string_view destName,
                                  std::string_view destType)
{
    for (const auto& tinfo : targetInformation) {
        if (tinfo.id == dest) {
            return;
        }
    }
    targetInformation.emplace_back(dest, destName, destType);
    /** now update the target information*/
    targets.reserve(targetInformation.size());
    targets.clear();
    for (const auto& tinfo : targetInformation) {
        targets.emplace_back(tinfo.id, tinfo.key);
    }
}